

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall VariationalBayesEstimatorOnLDA::runIteraions(VariationalBayesEstimatorOnLDA *this)

{
  iterator __position;
  ostream *poVar1;
  uint uVar2;
  double extraout_XMM0_Qa;
  double thisVariationalLowerBound;
  double local_40;
  double local_38;
  
  local_40 = 0.0;
  uVar2 = 1;
  while( true ) {
    local_38 = local_40;
    (*this->_vptr_VariationalBayesEstimatorOnLDA[6])(this);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[7])(this);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[10])(this);
    local_40 = extraout_XMM0_Qa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"VLB",3);
    poVar1 = std::ostream::_M_insert<double>(local_40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    __position._M_current =
         (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->_VLBTimeSeries,__position,&local_40
                );
    }
    else {
      *__position._M_current = local_40;
      (this->_VLBTimeSeries).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    if (NAN(local_40)) goto LAB_00112745;
    if ((1 < uVar2) && ((local_40 - local_38) / ABS(local_40) < this->_convergenceDiterminationRate)
       ) break;
    (*this->_vptr_VariationalBayesEstimatorOnLDA[9])(this);
    uVar2 = uVar2 + 1;
  }
  this->_variationalLowerBound = local_40;
LAB_00112745:
  (*this->_vptr_VariationalBayesEstimatorOnLDA[4])(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter:",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::runIteraions(){//{{{
    double prevVariationalLowerBound = 0;
    double thisVariationalLowerBound = 0;
    unsigned int count = 0;
    while(1){
        prevVariationalLowerBound = thisVariationalLowerBound;
        this->updateQz();
        this->updateNEx();
        thisVariationalLowerBound = this->calculateVariationalLowerBound();
        cout<<"VLB"<<thisVariationalLowerBound<<endl;
        _VLBTimeSeries.push_back(thisVariationalLowerBound);
        count++;
        if(std::isnan(thisVariationalLowerBound))break;
        if(count<2){
        }else if((thisVariationalLowerBound - prevVariationalLowerBound) / abs(thisVariationalLowerBound) < _convergenceDiterminationRate){
            _variationalLowerBound = thisVariationalLowerBound;
            break;
        }
        this->updateHyperParameters();
    }
    this->calculateEx();
    cout<<"iter:"<<count<<endl;
}